

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperiodicity_extraction_by_tandem.cc
# Opt level: O3

bool __thiscall
sptk::AperiodicityExtractionByTandem::Run
          (AperiodicityExtractionByTandem *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *aperiodicity)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pvVar4;
  double *x;
  undefined1 auVar5 [16];
  long lVar6;
  size_type __n;
  size_type __new_size;
  ulong uVar7;
  uint f0_length;
  vector<double,_std::allocator<double>_> *vector;
  pointer pvVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  vector<double_*,_std::allocator<double_*>_> pointers;
  pointer local_50;
  vector<double,_std::allocator<double>_> time_axis;
  
  if ((this->is_valid_ == true) &&
     ((waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    pdVar2 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (aperiodicity !=
        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *)0x0 && pdVar2 != pdVar3) {
      dVar12 = this->sampling_rate_;
      f0_length = (uint)((ulong)((long)pdVar3 - (long)pdVar2) >> 3);
      if (0 < (int)f0_length) {
        uVar7 = 0;
        do {
          if (pdVar2[uVar7] < 0.0) {
            return false;
          }
          if (dVar12 * 0.5 < pdVar2[uVar7]) {
            return false;
          }
          uVar7 = uVar7 + 1;
        } while ((f0_length & 0x7fffffff) != uVar7);
      }
      iVar1 = this->frame_shift_;
      __n = (size_type)(int)f0_length;
      std::vector<double,_std::allocator<double>_>::vector
                (&time_axis,__n,(allocator_type *)&pointers);
      auVar5 = _DAT_00118a10;
      if (0 < (int)f0_length) {
        dVar12 = (double)iVar1 / dVar12;
        lVar6 = (ulong)(f0_length & 0x7fffffff) - 1;
        auVar9._8_4_ = (int)lVar6;
        auVar9._0_8_ = lVar6;
        auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
        uVar7 = 0;
        auVar9 = auVar9 ^ _DAT_00118a10;
        auVar10 = _DAT_00118a00;
        do {
          auVar11 = auVar10 ^ auVar5;
          if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                      auVar9._4_4_ < auVar11._4_4_) & 1)) {
            time_axis.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] = (double)(int)uVar7 * dVar12;
          }
          if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
              auVar11._12_4_ <= auVar9._12_4_) {
            time_axis.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7 + 1] = (double)((int)uVar7 + 1) * dVar12;
          }
          uVar7 = uVar7 + 2;
          lVar6 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar6 + 2;
        } while ((f0_length + 1 & 0xfffffffe) != uVar7);
      }
      if (((long)(aperiodicity->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(aperiodicity->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __n != 0)
      {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(aperiodicity,__n);
      }
      if (0 < (int)f0_length) {
        __new_size = (size_type)(this->fft_length_ / 2 + 1);
        uVar7 = (ulong)(f0_length & 0x7fffffff);
        lVar6 = 0;
        do {
          pvVar8 = (aperiodicity->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data + lVar6 + 8) -
              *(long *)((long)&(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data + lVar6) >> 3 != __new_size) {
            std::vector<double,_std::allocator<double>_>::resize
                      ((vector<double,_std::allocator<double>_> *)
                       ((long)&(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data + lVar6),__new_size);
          }
          lVar6 = lVar6 + 0x18;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<double_*,_std::allocator<double_*>_>::reserve(&pointers,__n);
      pvVar8 = (aperiodicity->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = (aperiodicity->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pvVar8 != pvVar4) {
        do {
          local_50 = (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          if (pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double*,std::allocator<double*>>::_M_realloc_insert<double*>
                      ((vector<double*,std::allocator<double*>> *)&pointers,
                       (iterator)
                       pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_50);
          }
          else {
            *pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_50;
            pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          pvVar8 = pvVar8 + 1;
        } while (pvVar8 != pvVar4);
      }
      x = (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start;
      world::AperiodicityRatio
                (x,(int)((ulong)((long)(waveform->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_finish - (long)x) >> 3),
                 (int)this->sampling_rate_,
                 (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start,f0_length,
                 time_axis.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,this->fft_length_,
                 pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (time_axis.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(time_axis.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool AperiodicityExtractionByTandem::Run(
    const std::vector<double>& waveform, const std::vector<double>& f0,
    std::vector<std::vector<double> >* aperiodicity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty() || f0.empty() || NULL == aperiodicity) {
    return false;
  }

  // Check F0 values to prevent segmentation fault.
  const int f0_length(static_cast<int>(f0.size()));
  const double nyquist_frequency(0.5 * sampling_rate_);
  for (int i(0); i < f0_length; ++i) {
    if (f0[i] < 0.0 || nyquist_frequency < f0[i]) {
      return false;
    }
  }

  const double frame_shift_in_sec(frame_shift_ / sampling_rate_);
  std::vector<double> time_axis(f0_length);
  for (int i(0); i < f0_length; ++i) {
    time_axis[i] = i * frame_shift_in_sec;
  }

  // Prepare memories.
  if (aperiodicity->size() != static_cast<std::size_t>(f0_length)) {
    aperiodicity->resize(f0_length);
  }
  const int length(fft_length_ / 2 + 1);
  for (int i(0); i < f0_length; ++i) {
    if ((*aperiodicity)[i].size() != static_cast<std::size_t>(length)) {
      (*aperiodicity)[i].resize(length);
    }
  }

  std::vector<double*> pointers;
  pointers.reserve(f0_length);
  for (std::vector<double>& vector : *aperiodicity) {
    pointers.push_back(vector.data());
  }

  world::AperiodicityRatio(
      const_cast<double*>(waveform.data()), static_cast<int>(waveform.size()),
      static_cast<int>(sampling_rate_), const_cast<double*>(f0.data()),
      f0_length, const_cast<double*>(time_axis.data()), fft_length_,
      pointers.data());

  return true;
}